

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

int Cut_CutProcessTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,Cut_List_t *pSuperList)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Cut_Cut_t *pCVar5;
  Cut_Params_t *pCVar6;
  uint uVar7;
  Cut_Cut_t *pCut0_00;
  ulong uVar8;
  
  pCVar5 = pCut1;
  pCut0_00 = pCut0;
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    pCVar5 = pCut0;
    pCut0_00 = pCut1;
  }
  pCVar5 = Cut_CutMergeTwo(p,pCut0_00,pCVar5);
  uVar7 = 0;
  if (pCVar5 != (Cut_Cut_t *)0x0) {
    pCVar6 = p->pParams;
    if ((pCVar6->fSeq == 0) && (*(uint *)pCVar5 < 0x20000000)) {
      __assert_fail("p->pParams->fSeq || pCut->nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x142,
                    "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)");
    }
    pCVar5->uSign = pCut1->uSign | pCut0->uSign;
    if (pCVar6->fRecord != 0) {
      uVar1 = *(uint *)pCut0;
      uVar2 = *(uint *)pCVar5;
      *(uint *)pCVar5 = uVar2 & 0xfffff800 | uVar1 & 0x7ff;
      *(uint *)pCVar5 = uVar2 & 0xffc00000 | uVar1 & 0x7ff | (*(uint *)pCut1 & 0x7ff) << 0xb;
      pCVar6 = p->pParams;
    }
    if ((pCVar6->fFilter == 0) ||
       ((iVar4 = Cut_CutFilterOne(p,pSuperList,pCVar5), iVar4 == 0 &&
        ((p->pParams->fSeq == 0 ||
         (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
           (iVar4 = Cut_CutFilterOld(p,p->pCompareOld,pCVar5), iVar4 == 0)) &&
          ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
           (iVar4 = Cut_CutFilterOld(p,p->pCompareNew,pCVar5), uVar7 = 0, iVar4 == 0)))))))))) {
      if (p->pParams->fGlobal != 0) {
        pVVar3 = p->vNodeAttrs;
        if (pVVar3 == (Vec_Int_t *)0x0) {
          __assert_fail("p->vNodeAttrs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                        ,0x158,
                        "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)"
                       );
        }
        uVar7 = *(uint *)pCVar5;
        if ((uVar7 & 0xf0000000) != 0x10000000) {
          if (0xfffffff < uVar7) {
            uVar8 = 0;
            do {
              iVar4 = *(int *)(&pCVar5[1].field_0x0 + uVar8 * 4);
              if (((long)iVar4 < 0) || (pVVar3->nSize <= iVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (pVVar3->pArray[iVar4] != 0) goto LAB_004b6746;
              uVar8 = uVar8 + 1;
            } while (uVar7 >> 0x1c != uVar8);
          }
          p->nCutsFilter = p->nCutsFilter + 1;
          Cut_CutRecycle(p,pCVar5);
          return 0;
        }
      }
LAB_004b6746:
      if (p->pParams->fTruth != 0) {
        Cut_TruthCompute(p,pCVar5,pCut0,pCut1,p->fCompl0,p->fCompl1);
      }
      if (0xbfffffff < *(uint *)pCVar5 + 0xf0000000) {
        __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutList.h"
                      ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
      }
      *pSuperList->ppTail[*(uint *)pCVar5 >> 0x1c] = pCVar5;
      pSuperList->ppTail[*(uint *)pCVar5 >> 0x1c] = &pCVar5->pNext;
      iVar4 = p->nNodeCuts + 1;
      p->nNodeCuts = iVar4;
      uVar7 = (uint)(iVar4 == p->pParams->nKeepMax);
    }
  }
  return uVar7;
}

Assistant:

static inline int Cut_CutProcessTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, Cut_List_t * pSuperList )
{
    Cut_Cut_t * pCut;
    // merge the cuts
    if ( pCut0->nLeaves >= pCut1->nLeaves )
        pCut = Cut_CutMergeTwo( p, pCut0, pCut1 );
    else
        pCut = Cut_CutMergeTwo( p, pCut1, pCut0 );
    if ( pCut == NULL )
        return 0;
    assert( p->pParams->fSeq || pCut->nLeaves > 1 );
    // set the signature
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    if ( p->pParams->fRecord )
        pCut->Num0 = pCut0->Num0, pCut->Num1 = pCut1->Num0;
    // check containment
    if ( p->pParams->fFilter )
    {
        if ( Cut_CutFilterOne(p, pSuperList, pCut) )
//        if ( Cut_CutFilterOneEqual(p, pSuperList, pCut) )
            return 0;
        if ( p->pParams->fSeq )
        {
            if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                return 0;
            if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                return 0;
        }
    }

    if ( p->pParams->fGlobal )
    {
        assert( p->vNodeAttrs != NULL );
        if ( Cut_CutFilterGlobal( p, pCut ) )
            return 0;
    }

    // compute the truth table
    if ( p->pParams->fTruth )
        Cut_TruthCompute( p, pCut, pCut0, pCut1, p->fCompl0, p->fCompl1 );
    // add to the list
    Cut_ListAdd( pSuperList, pCut );
    // return status (0 if okay; 1 if exceeded the limit)
    return ++p->nNodeCuts == p->pParams->nKeepMax;
}